

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall
DLevelScript::DoSpawnSpot(DLevelScript *this,int type,int spot,int tid,int angle,bool force)

{
  AActor *pAVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  DAngle local_58;
  DVector3 local_50;
  DAngle local_38;
  
  if (spot == 0) {
    pAVar1 = (this->activator).field_0.p;
    iVar5 = 0;
    if (pAVar1 != (AActor *)0x0) {
      if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar1 = (this->activator).field_0.p;
        local_50.X = (pAVar1->__Pos).X;
        local_50.Y = (pAVar1->__Pos).Y;
        local_50.Z = (pAVar1->__Pos).Z;
        local_38.Degrees = (double)angle * 1.40625;
        iVar5 = DoSpawn(type,&local_50,tid,&local_38,force);
      }
      else {
        (this->activator).field_0.p = (AActor *)0x0;
      }
    }
  }
  else {
    lVar4 = 0;
    iVar5 = 0;
    while( true ) {
      plVar3 = (long *)(lVar4 + 0x288);
      if (lVar4 == 0) {
        plVar3 = (long *)((long)AActor::TIDHash + (ulong)((spot & 0x7fU) << 3));
      }
      for (lVar4 = *plVar3; (lVar4 != 0 && (*(int *)(lVar4 + 0x260) != spot));
          lVar4 = *(long *)(lVar4 + 0x288)) {
      }
      if (lVar4 == 0) break;
      local_50.X = *(double *)(lVar4 + 0x48);
      local_50.Y = *(double *)(lVar4 + 0x50);
      local_50.Z = *(double *)(lVar4 + 0x58);
      local_58.Degrees = (double)angle * 1.40625;
      iVar2 = DoSpawn(type,&local_50,tid,&local_58,force);
      iVar5 = iVar5 + iVar2;
    }
  }
  return iVar5;
}

Assistant:

int DLevelScript::DoSpawnSpot (int type, int spot, int tid, int angle, bool force)
{
	int spawned = 0;

	if (spot != 0)
	{
		FActorIterator iterator (spot);
		AActor *aspot;

		while ( (aspot = iterator.Next ()) )
		{
			spawned += DoSpawn (type, aspot->Pos(), tid, angle * (360. / 256), force);
		}
	}
	else if (activator != NULL)
	{
		spawned += DoSpawn (type, activator->Pos(), tid, angle * (360. / 256), force);
	}
	return spawned;
}